

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimSnapshotManager.cpp
# Opt level: O0

void __thiscall OpenMD::SimSnapshotManager::setCapacity(SimSnapshotManager *this,int param_2)

{
  snprintf(painCave.errMsg,2000,
           "SimSnapshotManager error: can not set capacity for SimSnapshotManager.\n");
  painCave.isFatal = 0;
  simError();
  return;
}

Assistant:

void SimSnapshotManager::setCapacity(int) {
    // give warning message
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "SimSnapshotManager error: can not set capacity for "
             "SimSnapshotManager.\n");
    painCave.isFatal = 0;
    simError();
  }